

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

JSValue JS_ToStringInternal(JSContext *ctx,JSValue val,BOOL is_ToPropertyKey)

{
  int iVar1;
  uint uVar2;
  undefined1 auVar3 [16];
  JSValueUnion JVar4;
  size_t buf_len;
  ulong uVar5;
  char *__s;
  JSValue JVar6;
  char buf [32];
  JSValueUnion local_b8 [17];
  
  local_b8[0] = val.u;
  __s = (char *)local_b8;
  uVar2 = (uint)val.tag;
  if (0xf < uVar2 + 8) {
switchD_001226c6_caseD_fffffffa:
    __s = "[unsupported type]";
    goto LAB_00122811;
  }
  switch(uVar2) {
  case 0:
    snprintf((char *)&local_b8[0].int32,0x20,"%d",(ulong)local_b8[0].ptr & 0xffffffff);
    __s = (char *)local_b8;
LAB_00122811:
    buf_len = strlen(__s);
LAB_00122848:
    val = JS_NewStringLen(ctx,__s,buf_len);
LAB_00122850:
    uVar5 = (ulong)val.u.ptr & 0xffffffff00000000;
    break;
  case 1:
    val = __JS_AtomToValue(ctx,3 - (val.u._0_4_ == 0),1);
    goto LAB_00122850;
  case 2:
    JVar4 = (JSValueUnion)((JSValueUnion *)(ctx->rt->atom_array + 1))->ptr;
    goto LAB_0012272e;
  case 3:
    JVar4 = (JSValueUnion)((JSValueUnion *)(ctx->rt->atom_array + 0x45))->ptr;
LAB_0012272e:
    *(int *)JVar4.ptr = *JVar4.ptr + 1;
    uVar5 = (ulong)JVar4.ptr & 0xffffffff00000000;
    val.tag = -7;
    val.u.ptr = JVar4.ptr;
    break;
  case 6:
    uVar5 = 0;
    auVar3._8_8_ = 0;
    auVar3._0_8_ = val.tag & 0xffffffff;
    val = (JSValue)(auVar3 << 0x40);
    break;
  case 7:
    js_dtoa1((char *)&local_b8[0].int32,local_b8[0].float64,10,0,0);
    buf_len = strlen((char *)&local_b8[0].int32);
    goto LAB_00122848;
  case 0xfffffff8:
    if (is_ToPropertyKey == 0) {
      JS_ThrowTypeError(ctx,"cannot convert symbol to string");
      val = (JSValue)(ZEXT816(6) << 0x40);
      uVar5 = 0;
      break;
    }
  case 0xfffffff9:
    if (0xfffffff4 < uVar2) {
      *(int *)local_b8[0].ptr = *local_b8[0].ptr + 1;
    }
LAB_001227e7:
    uVar5 = (ulong)val.u.ptr & 0xffffffff00000000;
    break;
  default:
    goto switchD_001226c6_caseD_fffffffa;
  case 0xfffffffe:
    __s = "[function bytecode]";
    goto LAB_00122811;
  case 0xffffffff:
    if (0xfffffff4 < uVar2) {
      *(int *)local_b8[0].ptr = *local_b8[0].ptr + 1;
    }
    JVar6 = JS_ToPrimitiveFree(ctx,val,0);
    JVar4 = JVar6.u;
    val = JVar6;
    if ((((uint)JVar6.tag != 6) &&
        (val = JS_ToStringInternal(ctx,JVar6,is_ToPropertyKey), 0xfffffff4 < (uint)JVar6.tag)) &&
       (iVar1 = *JVar4.ptr, *(int *)JVar4.ptr = iVar1 + -1, iVar1 < 2)) {
      local_b8[0] = JVar4;
      __JS_FreeValueRT(ctx->rt,JVar6);
    }
    goto LAB_001227e7;
  }
  JVar6.u.ptr = (void *)((ulong)val.u.ptr & 0xffffffff | uVar5);
  JVar6.tag = val.tag;
  return JVar6;
}

Assistant:

JSValue JS_ToStringInternal(JSContext *ctx, JSValueConst val, BOOL is_ToPropertyKey)
{
    uint32_t tag;
    const char *str;
    char buf[32];

    tag = JS_VALUE_GET_NORM_TAG(val);
    switch(tag) {
    case JS_TAG_STRING:
        return JS_DupValue(ctx, val);
    case JS_TAG_INT:
        snprintf(buf, sizeof(buf), "%d", JS_VALUE_GET_INT(val));
        str = buf;
        goto new_string;
    case JS_TAG_BOOL:
        return JS_AtomToString(ctx, JS_VALUE_GET_BOOL(val) ?
                          JS_ATOM_true : JS_ATOM_false);
    case JS_TAG_NULL:
        return JS_AtomToString(ctx, JS_ATOM_null);
    case JS_TAG_UNDEFINED:
        return JS_AtomToString(ctx, JS_ATOM_undefined);
    case JS_TAG_EXCEPTION:
        return JS_EXCEPTION;
    case JS_TAG_OBJECT:
        {
            JSValue val1, ret;
            val1 = JS_ToPrimitive(ctx, val, HINT_STRING);
            if (JS_IsException(val1))
                return val1;
            ret = JS_ToStringInternal(ctx, val1, is_ToPropertyKey);
            JS_FreeValue(ctx, val1);
            return ret;
        }
        break;
    case JS_TAG_FUNCTION_BYTECODE:
        str = "[function bytecode]";
        goto new_string;
    case JS_TAG_SYMBOL:
        if (is_ToPropertyKey) {
            return JS_DupValue(ctx, val);
        } else {
            return JS_ThrowTypeError(ctx, "cannot convert symbol to string");
        }
    case JS_TAG_FLOAT64:
        return js_dtoa(ctx, JS_VALUE_GET_FLOAT64(val), 10, 0,
                       JS_DTOA_VAR_FORMAT);
#ifdef CONFIG_BIGNUM
    case JS_TAG_BIG_INT:
        return ctx->rt->bigint_ops.to_string(ctx, val);
    case JS_TAG_BIG_FLOAT:
        return ctx->rt->bigfloat_ops.to_string(ctx, val);
    case JS_TAG_BIG_DECIMAL:
        return ctx->rt->bigdecimal_ops.to_string(ctx, val);
#endif
    default:
        str = "[unsupported type]";
    new_string:
        return JS_NewString(ctx, str);
    }
}